

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O3

int asn1_item_ex_i2d_opt
              (ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass,int optional)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ASN1_TEMPLATE *pAVar5;
  ASN1_VALUE **ppAVar6;
  ASN1_TEMPLATE *pAVar7;
  long lVar8;
  int seqcontlen;
  uint local_4c;
  long local_48;
  int local_3c;
  uchar **local_38;
  
  if ((aclass & 0xffffff3fU) != 0) {
    __assert_fail("(aclass & ASN1_TFLG_TAG_CLASS) == aclass",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x59,
                  "int asn1_item_ex_i2d_opt(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                 );
  }
  if (aclass != 0 && tag == -1) {
    __assert_fail("tag != -1 || aclass == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x5b,
                  "int asn1_item_ex_i2d_opt(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                 );
  }
  if (it->itype == '\0') {
    pAVar7 = (ASN1_TEMPLATE *)it->templates;
    if (pAVar7 == (ASN1_TEMPLATE *)0x0) {
LAB_00209c98:
      iVar1 = asn1_i2d_ex_primitive(pval,out,it,tag,aclass,optional);
      return iVar1;
    }
    if ((pAVar7->flags & 1) == 0) {
LAB_00209c4c:
      iVar1 = asn1_template_ex_i2d(pval,out,(ASN1_TEMPLATE *)pAVar7,tag,aclass,optional);
      return iVar1;
    }
    iVar1 = 0xc1;
    iVar3 = 0x6c;
  }
  else if (*pval == (ASN1_VALUE *)0x0) {
    if (optional != 0) {
      return 0;
    }
    iVar1 = 0x9b;
    iVar3 = 99;
  }
  else {
    switch(it->itype) {
    case '\x01':
      iVar1 = asn1_enc_restore((int *)&local_4c,out,(ASN1_VALUE **)pval,(ASN1_ITEM *)it);
      if (iVar1 < 0) {
        return -1;
      }
      if (iVar1 != 0) {
        return local_4c;
      }
      local_4c = 0;
      if (tag == -1) {
        aclass = 0;
      }
      local_3c = 0x10;
      if (tag != -1) {
        local_3c = tag;
      }
      local_38 = out;
      if (0 < it->tcount) {
        pAVar7 = (ASN1_TEMPLATE *)it->templates;
        lVar8 = 0;
        do {
          pAVar5 = asn1_do_adb((ASN1_VALUE **)pval,pAVar7,1);
          if (pAVar5 == (ASN1_TEMPLATE *)0x0) {
            return -1;
          }
          local_48 = lVar8;
          ppAVar6 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar5);
          iVar1 = asn1_template_ex_i2d
                            ((ASN1_VALUE **)ppAVar6,(uchar **)0x0,(ASN1_TEMPLATE *)pAVar5,-1,0,0);
          if (iVar1 == -1) {
            return -1;
          }
          if ((int)(local_4c ^ 0x7fffffff) < iVar1) {
            return -1;
          }
          local_4c = local_4c + iVar1;
          pAVar7 = (ASN1_TEMPLATE *)&pAVar7->item;
          lVar8 = local_48 + 1;
        } while (lVar8 < it->tcount);
      }
      iVar1 = local_3c;
      iVar3 = ASN1_object_size(1,local_4c,local_3c);
      if (local_38 == (uchar **)0x0) {
        return iVar3;
      }
      if (iVar3 != -1) {
        ASN1_put_object(local_38,1,local_4c,iVar1,aclass);
        if (it->tcount < 1) {
          return iVar3;
        }
        local_48 = CONCAT44(local_48._4_4_,iVar3);
        pAVar7 = (ASN1_TEMPLATE *)it->templates;
        lVar8 = 0;
        while( true ) {
          pAVar5 = asn1_do_adb((ASN1_VALUE **)pval,pAVar7,1);
          if (pAVar5 == (ASN1_TEMPLATE *)0x0) {
            return -1;
          }
          ppAVar6 = asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar5);
          iVar1 = asn1_template_ex_i2d
                            ((ASN1_VALUE **)ppAVar6,local_38,(ASN1_TEMPLATE *)pAVar5,-1,0,0);
          if (iVar1 < 0) break;
          pAVar7 = (ASN1_TEMPLATE *)&pAVar7->item;
          lVar8 = lVar8 + 1;
          if (it->tcount <= lVar8) {
            return (int)local_48;
          }
        }
        return -1;
      }
      return -1;
    case '\x02':
      if (tag == -1) {
        uVar2 = asn1_get_choice_selector((ASN1_VALUE **)pval,(ASN1_ITEM *)it);
        if (((int)uVar2 < 0) || (uVar4 = (ulong)uVar2, it->tcount <= (long)uVar4)) {
          iVar1 = 0xa3;
          iVar3 = 0x86;
        }
        else {
          if ((it->templates[uVar4].flags & 1) == 0) {
            pAVar7 = (ASN1_TEMPLATE *)(it->templates + uVar4);
            pval = (ASN1_VALUE **)asn1_get_field_ptr((ASN1_VALUE **)pval,pAVar7);
            tag = -1;
            aclass = 0;
            optional = 0;
            goto LAB_00209c4c;
          }
          iVar1 = 0xc1;
          iVar3 = 0x8b;
        }
      }
      else {
        iVar1 = 0xc1;
        iVar3 = 0x81;
      }
      break;
    default:
      iVar1 = 0xc1;
      iVar3 = 0xdf;
      break;
    case '\x04':
      if (tag == -1) {
        iVar1 = (**(code **)((long)it->funcs + 0x18))(pval,out,it);
        if (iVar1 != 0) {
          return iVar1;
        }
        iVar1 = 0x44;
        iVar3 = 0x9f;
      }
      else {
        iVar1 = 0xc1;
        iVar3 = 0x95;
      }
      break;
    case '\x05':
      if (tag == -1) {
        tag = -1;
        aclass = 0;
        goto LAB_00209c98;
      }
      iVar1 = 0xc1;
      iVar3 = 0x78;
    }
  }
  ERR_put_error(0xc,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                ,iVar3);
  return -1;
}

Assistant:

int asn1_item_ex_i2d_opt(ASN1_VALUE **pval, unsigned char **out,
                         const ASN1_ITEM *it, int tag, int aclass,
                         int optional) {
  const ASN1_TEMPLATE *tt = NULL;
  int i, seqcontlen, seqlen;

  // Historically, |aclass| was repurposed to pass additional flags into the
  // encoding process.
  assert((aclass & ASN1_TFLG_TAG_CLASS) == aclass);
  // If not overridding the tag, |aclass| is ignored and should be zero.
  assert(tag != -1 || aclass == 0);

  // All fields are pointers, except for boolean |ASN1_ITYPE_PRIMITIVE|s.
  // Optional primitives are handled later.
  if ((it->itype != ASN1_ITYPE_PRIMITIVE) && !*pval) {
    if (optional) {
      return 0;
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  switch (it->itype) {
    case ASN1_ITYPE_PRIMITIVE:
      if (it->templates) {
        // This is an |ASN1_ITEM_TEMPLATE|.
        if (it->templates->flags & ASN1_TFLG_OPTIONAL) {
          OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
          return -1;
        }
        return asn1_template_ex_i2d(pval, out, it->templates, tag, aclass,
                                    optional);
      }
      return asn1_i2d_ex_primitive(pval, out, it, tag, aclass, optional);

    case ASN1_ITYPE_MSTRING:
      // It never makes sense for multi-strings to have implicit tagging, so
      // if tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      return asn1_i2d_ex_primitive(pval, out, it, -1, 0, optional);

    case ASN1_ITYPE_CHOICE: {
      // It never makes sense for CHOICE types to have implicit tagging, so if
      // tag != -1, then this looks like an error in the template.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      i = asn1_get_choice_selector(pval, it);
      if (i < 0 || i >= it->tcount) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NO_MATCHING_CHOICE_TYPE);
        return -1;
      }
      const ASN1_TEMPLATE *chtt = it->templates + i;
      if (chtt->flags & ASN1_TFLG_OPTIONAL) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      ASN1_VALUE **pchval = asn1_get_field_ptr(pval, chtt);
      return asn1_template_ex_i2d(pchval, out, chtt, -1, 0, /*optional=*/0);
    }

    case ASN1_ITYPE_EXTERN: {
      // We don't support implicit tagging with external types.
      if (tag != -1) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
        return -1;
      }
      const ASN1_EXTERN_FUNCS *ef =
          reinterpret_cast<const ASN1_EXTERN_FUNCS *>(it->funcs);
      int ret = ef->asn1_ex_i2d(pval, out, it);
      if (ret == 0) {
        // |asn1_ex_i2d| should never return zero. We have already checked
        // for optional values generically, and |ASN1_ITYPE_EXTERN| fields
        // must be pointers.
        OPENSSL_PUT_ERROR(ASN1, ERR_R_INTERNAL_ERROR);
        return -1;
      }
      return ret;
    }

    case ASN1_ITYPE_SEQUENCE: {
      i = asn1_enc_restore(&seqcontlen, out, pval, it);
      // An error occurred
      if (i < 0) {
        return -1;
      }
      // We have a valid cached encoding...
      if (i > 0) {
        return seqcontlen;
      }
      // Otherwise carry on
      seqcontlen = 0;
      // If no IMPLICIT tagging set to SEQUENCE, UNIVERSAL
      if (tag == -1) {
        tag = V_ASN1_SEQUENCE;
        aclass = V_ASN1_UNIVERSAL;
      }
      // First work out sequence content length
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        int tmplen;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (!seqtt) {
          return -1;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        tmplen =
            asn1_template_ex_i2d(pseqval, NULL, seqtt, -1, 0, /*optional=*/0);
        if (tmplen == -1 || (tmplen > INT_MAX - seqcontlen)) {
          return -1;
        }
        seqcontlen += tmplen;
      }

      seqlen = ASN1_object_size(/*constructed=*/1, seqcontlen, tag);
      if (!out || seqlen == -1) {
        return seqlen;
      }
      // Output SEQUENCE header
      ASN1_put_object(out, /*constructed=*/1, seqcontlen, tag, aclass);
      for (i = 0, tt = it->templates; i < it->tcount; tt++, i++) {
        const ASN1_TEMPLATE *seqtt;
        ASN1_VALUE **pseqval;
        seqtt = asn1_do_adb(pval, tt, 1);
        if (!seqtt) {
          return -1;
        }
        pseqval = asn1_get_field_ptr(pval, seqtt);
        if (asn1_template_ex_i2d(pseqval, out, seqtt, -1, 0, /*optional=*/0) <
            0) {
          return -1;
        }
      }
      return seqlen;
    }

    default:
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_BAD_TEMPLATE);
      return -1;
  }
}